

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::createAdvanceCall(FunctionResolver *this,CallOrCast *c)

{
  size_t sVar1;
  Expression *pEVar2;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if ((c->super_CallOrCastBase).isMethodCall == true) {
    Errors::advanceIsNotAMethod<>();
    AST::Context::throwError
              (&(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context,
               &local_48,false);
  }
  sVar1 = AST::CallOrCastBase::getNumArguments(&c->super_CallOrCastBase);
  if (sVar1 == 0) {
    pEVar2 = &PoolAllocator::allocate<soul::AST::AdvanceClock,soul::AST::Context&>
                        (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                         &(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject
                          .context)->super_Expression;
    return pEVar2;
  }
  Errors::advanceHasNoArgs<>();
  AST::Context::throwError
            (&(c->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context,
             &local_80,false);
}

Assistant:

AST::Expression& createAdvanceCall (AST::CallOrCast& c)
        {
            if (c.isMethodCall)             c.context.throwError (Errors::advanceIsNotAMethod());
            if (c.getNumArguments() != 0)   c.context.throwError (Errors::advanceHasNoArgs());

            return allocator.allocate<AST::AdvanceClock> (c.context);
        }